

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O0

TiXmlElement * __thiscall TiXmlNode::NextSiblingElement(TiXmlNode *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TiXmlNode *local_20;
  TiXmlNode *node;
  TiXmlNode *this_local;
  
  local_20 = NextSibling(this);
  while( true ) {
    if (local_20 == (TiXmlNode *)0x0) {
      return (TiXmlElement *)0x0;
    }
    iVar1 = (*(local_20->super_TiXmlBase)._vptr_TiXmlBase[5])();
    if (CONCAT44(extraout_var,iVar1) != 0) break;
    local_20 = NextSibling(local_20);
  }
  iVar1 = (*(local_20->super_TiXmlBase)._vptr_TiXmlBase[5])();
  return (TiXmlElement *)CONCAT44(extraout_var_00,iVar1);
}

Assistant:

const TiXmlElement* TiXmlNode::NextSiblingElement() const
{
	const TiXmlNode* node;

	for (	node = NextSibling();
			node;
			node = node->NextSibling() )
	{
		if ( node->ToElement() )
			return node->ToElement();
	}
	return 0;
}